

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  ImGuiNextWindowData *pIVar4;
  int *piVar5;
  ImVec2 *pIVar6;
  ImVec2 *pIVar7;
  ImFontAtlas *pIVar8;
  char *pcVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  int n;
  uint uVar16;
  ImGuiID IVar17;
  ImGuiInputSource IVar18;
  int iVar19;
  ImFont **ppIVar20;
  long lVar21;
  ImFont *font;
  ImGuiWindow *pIVar22;
  ImGuiPopupData *pIVar23;
  ImGuiWindow **ppIVar24;
  ImRect *pIVar25;
  int i_1;
  ImGuiID IVar26;
  ImGuiWindow *window;
  long lVar27;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar28;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiNavMoveResult *pIVar29;
  int i_2;
  int i;
  float *pfVar30;
  ImGuiNavLayer IVar31;
  float *pfVar32;
  byte bVar33;
  ImGuiContext *pIVar34;
  ImGuiWindow *old_nav_window;
  bool *pbVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  uint uVar39;
  float fVar40;
  ImVec2 IVar41;
  ImVec2 IVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar47;
  double dVar46;
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  long lStack_70;
  ImRect local_48;
  ImGuiContext *local_38;
  
  pIVar34 = GImGui;
  bVar38 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdfc,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde4,"void NewFrameSanityChecks()");
  }
  iVar19 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar19 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xde5,"void NewFrameSanityChecks()");
    }
  }
  else if ((iVar19 != 0) && (GImGui->FrameCountEnded != iVar19)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde6,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde7,"void NewFrameSanityChecks()");
  }
  pIVar8 = (GImGui->IO).Fonts;
  if ((pIVar8->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde8,"void NewFrameSanityChecks()");
  }
  ppIVar20 = ImVector<ImFont_*>::operator[](&pIVar8->Fonts,0);
  if ((*ppIVar20)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xde9,"void NewFrameSanityChecks()");
  }
  if ((pIVar34->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdea,"void NewFrameSanityChecks()");
  }
  fVar55 = (pIVar34->Style).Alpha;
  if ((fVar55 < 0.0) || (1.0 < fVar55)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdeb,"void NewFrameSanityChecks()");
  }
  if (((pIVar34->Style).WindowMinSize.x < 1.0) || ((pIVar34->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdec,"void NewFrameSanityChecks()");
  }
  if (2 < (pIVar34->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xded,"void NewFrameSanityChecks()");
  }
  lVar21 = 0;
  while (lVar21 != 0x16) {
    piVar5 = (pIVar34->IO).KeyMap + lVar21;
    lVar21 = lVar21 + 1;
    if (0x200 < *piVar5 + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xdef,"void NewFrameSanityChecks()");
    }
  }
  if ((((pIVar34->IO).ConfigFlags & 1) != 0) && ((pIVar34->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xdf3,"void NewFrameSanityChecks()");
  }
  if (((pIVar34->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar34->IO).BackendFlags & 2) == 0)) {
    (pIVar34->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar34->SettingsLoaded == false) {
    if ((pIVar34->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0xe09,"void ImGui::NewFrame()");
    }
    pcVar9 = (pIVar34->IO).IniFilename;
    if (pcVar9 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar9);
    }
    pIVar34->SettingsLoaded = true;
  }
  fVar55 = (pIVar34->IO).DeltaTime;
  if ((0.0 < pIVar34->SettingsDirtyTimer) &&
     (fVar49 = pIVar34->SettingsDirtyTimer - fVar55, pIVar34->SettingsDirtyTimer = fVar49,
     fVar49 <= 0.0)) {
    pcVar9 = (pIVar34->IO).IniFilename;
    if (pcVar9 == (char *)0x0) {
      (pIVar34->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar9);
      fVar55 = (pIVar34->IO).DeltaTime;
    }
    pIVar34->SettingsDirtyTimer = 0.0;
  }
  pIVar34->Time = (double)fVar55 + pIVar34->Time;
  pIVar34->WithinFrameScope = true;
  pIVar34->FrameCount = pIVar34->FrameCount + 1;
  pIVar34->TooltipOverrideCount = 0;
  pIVar34->WindowsActiveCount = 0;
  ((pIVar34->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar34->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0xe26,"void ImGui::NewFrame()");
  }
  fVar55 = (pIVar34->IO).DisplaySize.x;
  fVar49 = (pIVar34->IO).DisplaySize.y;
  (pIVar34->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar34->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar34->DrawListSharedData).ClipRectFullscreen.z = fVar55;
  (pIVar34->DrawListSharedData).ClipRectFullscreen.w = fVar49;
  (pIVar34->DrawListSharedData).CurveTessellationTol = (pIVar34->Style).CurveTessellationTol;
  bVar14 = (pIVar34->Style).AntiAliasedLines;
  uVar16 = (uint)bVar14;
  (pIVar34->DrawListSharedData).InitialFlags = (uint)bVar14;
  if ((pIVar34->Style).AntiAliasedFill == true) {
    uVar16 = bVar14 | 2;
    (pIVar34->DrawListSharedData).InitialFlags = uVar16;
  }
  if (((pIVar34->IO).BackendFlags & 8) != 0) {
    (pIVar34->DrawListSharedData).InitialFlags = uVar16 | 4;
  }
  pIVar1 = &pIVar34->BackgroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar34->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar34->ForegroundDrawList;
  ImDrawList::Clear(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar34->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar34->DrawData).Valid = false;
  (pIVar34->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar34->DrawData).CmdListsCount = 0;
  (pIVar34->DrawData).TotalIdxCount = 0;
  (pIVar34->DrawData).TotalVtxCount = 0;
  (pIVar34->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar34->DrawData).DisplayPos.y = 0;
  (pIVar34->DrawData).DisplaySize.x = 0.0;
  (pIVar34->DrawData).DisplaySize.y = 0.0;
  (pIVar34->DrawData).FramebufferScale.x = 0.0;
  (pIVar34->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar34->DragDropActive == true) &&
     (IVar26 = (pIVar34->DragDropPayload).SourceId, IVar26 == pIVar34->ActiveId)) {
    KeepAliveID(IVar26);
  }
  if (pIVar34->HoveredIdPreviousFrame == 0) {
    IVar26 = pIVar34->HoveredId;
    pIVar34->HoveredIdTimer = 0.0;
    pIVar34->HoveredIdNotActiveTimer = 0.0;
    if (IVar26 == 0) goto LAB_001cac40;
LAB_001cac15:
    fVar55 = (pIVar34->IO).DeltaTime;
    pIVar34->HoveredIdTimer = pIVar34->HoveredIdTimer + fVar55;
    IVar17 = IVar26;
    if (pIVar34->ActiveId != IVar26) {
      pIVar34->HoveredIdNotActiveTimer = fVar55 + pIVar34->HoveredIdNotActiveTimer;
      IVar17 = pIVar34->ActiveId;
    }
  }
  else {
    IVar26 = pIVar34->HoveredId;
    if (IVar26 != 0) {
      if (pIVar34->ActiveId == IVar26) {
        pIVar34->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001cac15;
    }
LAB_001cac40:
    IVar26 = 0;
    IVar17 = pIVar34->ActiveId;
  }
  pIVar34->HoveredIdPreviousFrame = IVar26;
  pIVar34->HoveredId = 0;
  pIVar34->HoveredIdAllowOverlap = false;
  if (((pIVar34->ActiveIdIsAlive != IVar17) && (IVar17 != 0)) &&
     (pIVar34->ActiveIdPreviousFrame == IVar17)) {
    ClearActiveID();
    IVar17 = pIVar34->ActiveId;
  }
  fVar55 = (pIVar34->IO).DeltaTime;
  if (IVar17 != 0) {
    pIVar34->ActiveIdTimer = pIVar34->ActiveIdTimer + fVar55;
  }
  pIVar34->LastActiveIdTimer = pIVar34->LastActiveIdTimer + fVar55;
  pIVar34->ActiveIdPreviousFrame = IVar17;
  pIVar34->ActiveIdPreviousFrameWindow = pIVar34->ActiveIdWindow;
  pIVar34->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar34->ActiveIdHasBeenEditedBefore;
  pIVar34->ActiveIdIsAlive = 0;
  pIVar34->ActiveIdHasBeenEditedThisFrame = false;
  pIVar34->ActiveIdPreviousFrameIsAlive = false;
  pIVar34->ActiveIdIsJustActivated = false;
  if (pIVar34->TempInputTextId == 0) {
LAB_001cad25:
    if (IVar17 == 0) {
      pIVar34->ActiveIdUsingNavDirMask = 0;
      pIVar34->ActiveIdUsingNavInputMask = 0;
      pIVar34->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar17 != pIVar34->TempInputTextId) {
    pIVar34->TempInputTextId = 0;
    goto LAB_001cad25;
  }
  pIVar34->DragDropAcceptIdPrev = pIVar34->DragDropAcceptIdCurr;
  pIVar34->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar34->DragDropAcceptIdCurr = 0;
  pIVar34->DragDropWithinSourceOrTarget = false;
  pfVar2 = (pIVar34->IO).KeysDownDuration;
  memcpy((pIVar34->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar21 = 0; pIVar12 = GImGui, lVar21 != 0x200; lVar21 = lVar21 + 1) {
    fVar49 = -1.0;
    if ((pIVar34->IO).KeysDown[lVar21] == true) {
      fVar49 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar49 = pfVar2[lVar21] + fVar55;
      }
    }
    pfVar2[lVar21] = fVar49;
  }
  local_38 = pIVar34;
  (GImGui->IO).WantSetMousePos = false;
  uVar16 = (pIVar12->IO).ConfigFlags;
  if (((uVar16 & 2) == 0) || (((pIVar12->IO).BackendFlags & 1) == 0)) {
    bVar33 = 0;
  }
  else if (((0.0 < (pIVar12->IO).NavInputs[0]) || (0.0 < (pIVar12->IO).NavInputs[2])) ||
          ((0.0 < (pIVar12->IO).NavInputs[1] || (bVar33 = 1, 0.0 < (pIVar12->IO).NavInputs[3])))) {
    pIVar12->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar33 = 1;
  }
  if ((uVar16 & 1) != 0) {
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xc]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xd]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[2] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[0xe]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[1] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[1]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x11] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[2]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x12] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[3]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x13] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = IsKeyDown((pIVar12->IO).KeyMap[4]);
    if (bVar14) {
      (pIVar12->IO).NavInputs[0x14] = 1.0;
      pIVar12->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar14 = (pIVar12->IO).KeyCtrl;
    if (bVar14 == true) {
      (pIVar12->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar12->IO).KeyShift == true) {
      (pIVar12->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar14 == false) && ((pIVar12->IO).KeyAlt != false)) {
      (pIVar12->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar12->IO).NavInputsDownDuration;
  pfVar30 = pfVar2;
  pfVar32 = (pIVar12->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0x15; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pfVar32 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar38 * -2 + 1;
    pfVar32 = pfVar32 + (ulong)bVar38 * -2 + 1;
  }
  for (lVar21 = 0; lVar21 != 0x15; lVar21 = lVar21 + 1) {
    fVar55 = -1.0;
    if (0.0 < (pIVar12->IO).NavInputs[lVar21]) {
      fVar55 = 0.0;
      if (0.0 <= pfVar2[lVar21]) {
        fVar55 = pfVar2[lVar21] + (pIVar12->IO).DeltaTime;
      }
    }
    pfVar2[lVar21] = fVar55;
  }
  IVar26 = pIVar12->NavInitResultId;
  if ((IVar26 != 0) &&
     (((pIVar12->NavDisableHighlight != true || (pIVar12->NavInitRequestFromMove == true)) &&
      (pIVar12->NavWindow != (ImGuiWindow *)0x0)))) {
    if (pIVar12->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar26,pIVar12->NavLayer,0,&pIVar12->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar26,pIVar12->NavLayer,0);
    }
    IVar41 = (pIVar12->NavInitResultRectRel).Max;
    pIVar6 = &pIVar12->NavWindow->NavRectRel[pIVar12->NavLayer].Min;
    *pIVar6 = (pIVar12->NavInitResultRectRel).Min;
    pIVar6[1] = IVar41;
  }
  pIVar12->NavInitRequest = false;
  pIVar12->NavInitRequestFromMove = false;
  pIVar12->NavInitResultId = 0;
  pIVar12->NavJustMovedToId = 0;
  pIVar34 = GImGui;
  if (pIVar12->NavMoveRequest == true) {
    IVar26 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar26 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar34->NavDisableHighlight = false;
        pIVar34->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar29 = &GImGui->NavMoveResultLocal;
      if (IVar26 == 0) {
        pIVar29 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar26 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar26 != 0)) &&
         (IVar26 != GImGui->NavId)) {
        pIVar29 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar29 == pIVar3) {
LAB_001cb148:
        pIVar29 = pIVar3;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar55 = (GImGui->NavMoveResultOther).DistBox;
        fVar49 = pIVar29->DistBox;
        if (fVar49 <= fVar55) {
          if (((fVar55 != fVar49) || (NAN(fVar55) || NAN(fVar49))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar29->DistCenter < *pfVar2 || pIVar29->DistCenter == *pfVar2)) goto LAB_001cb14b;
        }
        goto LAB_001cb148;
      }
LAB_001cb14b:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar22 = pIVar29->Window, pIVar22 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                      ,0x218c,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          IVar41 = (pIVar29->RectRel).Min;
          IVar43 = (pIVar29->RectRel).Max;
          fVar55 = (pIVar22->Pos).x;
          fVar49 = (pIVar22->Pos).y;
          local_48.Max.x = IVar43.x + fVar55;
          local_48.Max.y = IVar43.y + fVar49;
          local_48.Min.y = IVar41.y + fVar49;
          local_48.Min.x = IVar41.x + fVar55;
          IVar41 = ScrollToBringRectIntoView(pIVar29->Window,&local_48);
        }
        else {
          fVar55 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar55 = (pIVar22->ScrollMax).y;
          }
          IVar41 = (ImVec2)((ulong)(uint)((pIVar22->Scroll).y - fVar55) << 0x20);
          (pIVar22->ScrollTarget).y = fVar55;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar55 = (pIVar29->RectRel).Min.y;
        fVar49 = (pIVar29->RectRel).Max.x;
        fVar50 = (pIVar29->RectRel).Max.y;
        (pIVar29->RectRel).Min.x = (pIVar29->RectRel).Min.x - IVar41.x;
        (pIVar29->RectRel).Min.y = fVar55 - IVar41.y;
        (pIVar29->RectRel).Max.x = fVar49 - IVar41.x;
        (pIVar29->RectRel).Max.y = fVar50 - IVar41.y;
      }
      ClearActiveID();
      pIVar34->NavWindow = pIVar29->Window;
      IVar26 = pIVar29->ID;
      if (pIVar34->NavId == IVar26) {
        IVar17 = pIVar29->FocusScopeId;
      }
      else {
        pIVar34->NavJustMovedToId = IVar26;
        IVar17 = pIVar29->FocusScopeId;
        pIVar34->NavJustMovedToFocusScopeId = IVar17;
      }
      SetNavIDWithRectRel(IVar26,pIVar34->NavLayer,IVar17,&pIVar29->RectRel);
      pIVar34->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar12->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2097,"void ImGui::NavUpdate()");
    }
    if (((pIVar12->NavMoveResultLocal).ID == 0) && ((pIVar12->NavMoveResultOther).ID == 0)) {
      pIVar12->NavDisableHighlight = false;
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar12->NavMousePosDirty == true) && (pIVar12->NavIdIsAlive == true)) {
    if ((((pIVar12->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar12->IO).BackendFlags & 4) != 0 && (pIVar12->NavDisableHighlight == false)) &&
         (pIVar12->NavDisableMouseHover == true)) && (pIVar12->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar41 = NavCalcPreferredRefPos();
      (pIVar12->IO).MousePosPrev = IVar41;
      (pIVar12->IO).MousePos = IVar41;
      (pIVar12->IO).WantSetMousePos = true;
    }
    pIVar12->NavMousePosDirty = false;
  }
  pIVar12->NavIdIsAlive = false;
  pIVar12->NavJustTabbedId = 0;
  IVar31 = pIVar12->NavLayer;
  if (ImGuiNavLayer_Menu < IVar31) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20ad,"void ImGui::NavUpdate()");
  }
  pIVar22 = pIVar12->NavWindow;
  pIVar28 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    for (; pIVar28 != (ImGuiWindow *)0x0; pIVar28 = pIVar28->ParentWindow) {
      if ((pIVar28->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar28 != pIVar22) {
          pIVar28->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
    }
    if ((IVar31 == ImGuiNavLayer_Main) && (pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar34 = GImGui;
  pIVar22 = GetTopMostPopupModal();
  if (pIVar22 == (ImGuiWindow *)0x0) {
    if (pIVar34->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar34->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001cb3cd;
LAB_001cb3d4:
      bVar14 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
      if (((pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar34->IO).KeyCtrl == true))
         && (bVar36 = IsKeyPressedMap(0,true), bVar36)) {
        bVar38 = (byte)(pIVar34->IO).ConfigFlags;
        uVar39 = (uint)bVar38;
        if (bVar14 || (bVar38 & 1) != 0) {
LAB_001cb41a:
          pIVar22 = pIVar34->NavWindow;
          if ((pIVar22 != (ImGuiWindow *)0x0) ||
             (pIVar22 = FindWindowNavFocusable
                                  ((pIVar34->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar22 != (ImGuiWindow *)0x0)) {
            pIVar34->NavWindowingTargetAnim = pIVar22;
            pIVar34->NavWindowingTarget = pIVar22;
            pIVar34->NavWindowingTimer = 0.0;
            pIVar34->NavWindowingHighlightAlpha = 0.0;
            pIVar34->NavWindowingToggleLayer = (bool)(~(byte)uVar39 & 1);
            pIVar34->NavInputSource = ImGuiInputSource_NavGamepad - (uVar39 & 1);
          }
        }
      }
      else if (bVar14) {
        uVar39 = 0;
        goto LAB_001cb41a;
      }
      bVar14 = pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar55 = (pIVar34->IO).DeltaTime * -10.0 + pIVar34->NavWindowingHighlightAlpha;
        fVar55 = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
        pIVar34->NavWindowingHighlightAlpha = fVar55;
        if ((pIVar34->DimBgRatio <= 0.0) && (fVar55 <= 0.0)) {
          pIVar34->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_001cb3d4;
      }
LAB_001cb3cd:
      bVar14 = false;
    }
    fVar55 = (pIVar34->IO).DeltaTime + pIVar34->NavWindowingTimer;
    pIVar34->NavWindowingTimer = fVar55;
    if (bVar14) {
LAB_001cb5ff:
      bVar14 = false;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    else {
      IVar18 = pIVar34->NavInputSource;
      if (IVar18 != ImGuiInputSource_NavGamepad) {
LAB_001cb572:
        if (IVar18 == ImGuiInputSource_NavKeyboard) {
          fVar49 = (pIVar34->NavWindowingTimer + -0.2) / 0.05;
          fVar55 = 1.0;
          if (fVar49 <= 1.0) {
            fVar55 = fVar49;
          }
          fVar55 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar55);
          uVar39 = -(uint)(fVar55 <= pIVar34->NavWindowingHighlightAlpha);
          pIVar34->NavWindowingHighlightAlpha =
               (float)(uVar39 & (uint)pIVar34->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar55);
          bVar14 = IsKeyPressedMap(0,true);
          if (bVar14) {
            NavUpdateWindowingHighlightWindow((pIVar34->IO).KeyShift - 1 | 1);
          }
          if ((pIVar34->IO).KeyCtrl == false) {
            pIVar22 = pIVar34->NavWindowingTarget;
            bVar14 = false;
            goto LAB_001cb60a;
          }
        }
        goto LAB_001cb5ff;
      }
      fVar49 = (fVar55 + -0.2) / 0.05;
      fVar55 = 1.0;
      if (fVar49 <= 1.0) {
        fVar55 = fVar49;
      }
      fVar55 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar55);
      uVar39 = -(uint)(fVar55 <= pIVar34->NavWindowingHighlightAlpha);
      pIVar34->NavWindowingHighlightAlpha =
           (float)(uVar39 & (uint)pIVar34->NavWindowingHighlightAlpha | ~uVar39 & (uint)fVar55);
      bVar14 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar36 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar14 - (uint)bVar36 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar14 - (uint)bVar36);
        pIVar34->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar34->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001cb5ff;
        IVar18 = pIVar34->NavInputSource;
        goto LAB_001cb572;
      }
      pbVar35 = &pIVar34->NavWindowingToggleLayer;
      *pbVar35 = (bool)(*pbVar35 &
                       (pIVar34->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar34->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar35 == false) {
        pIVar22 = pIVar34->NavWindowingTarget;
        bVar14 = false;
      }
      else {
        bVar14 = pIVar34->NavWindow != (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
      }
      pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_001cb60a:
    dir_sources = 1;
    bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
    if (bVar36) {
      pIVar34->NavWindowingToggleLayer = true;
    }
    if (((pIVar34->ActiveId == 0) || (pIVar34->ActiveIdAllowOverlap == true)) &&
       ((pIVar34->NavWindowingToggleLayer == true &&
        (bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar36)))) {
      bVar36 = IsMousePosValid(&(pIVar34->IO).MousePos);
      bVar37 = IsMousePosValid(&(pIVar34->IO).MousePosPrev);
      bVar14 = (bool)(bVar37 == bVar36 | bVar14);
    }
    pIVar28 = pIVar34->NavWindowingTarget;
    if ((pIVar28 != (ImGuiWindow *)0x0) && ((pIVar28->Flags & 4) == 0)) {
      if (pIVar34->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_001cb710:
        IVar41 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar41.x = 0.0;
        IVar41.y = 0.0;
        if ((pIVar34->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar34->IO).KeyShift == false)) goto LAB_001cb710;
      }
      fVar55 = IVar41.x;
      fVar49 = IVar41.y;
      if ((((fVar55 != 0.0) || (NAN(fVar55))) || (fVar49 != 0.0)) || (NAN(fVar49))) {
        fVar50 = (pIVar34->IO).DisplayFramebufferScale.x;
        fVar40 = (pIVar34->IO).DisplayFramebufferScale.y;
        if (fVar40 <= fVar50) {
          fVar50 = fVar40;
        }
        fVar50 = (float)(int)(fVar50 * (pIVar34->IO).DeltaTime * 800.0);
        IVar41 = pIVar28->RootWindow->Pos;
        local_48.Min.y = IVar41.y + fVar49 * fVar50;
        local_48.Min.x = IVar41.x + fVar55 * fVar50;
        SetWindowPos(pIVar28->RootWindow,&local_48.Min,1);
        pIVar34->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar34->NavWindowingTarget);
      }
    }
    if (pIVar22 != (ImGuiWindow *)0x0) {
      if ((pIVar34->NavWindow == (ImGuiWindow *)0x0) || (pIVar22 != pIVar34->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar34->NavDisableHighlight = false;
        pIVar34->NavDisableMouseHover = true;
        pIVar28 = pIVar22->NavLastChildNavWindow;
        if (pIVar22->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar28 = pIVar22;
        }
        ClosePopupsOverWindow(pIVar28,false);
        FocusWindow(pIVar28);
        if (pIVar28->NavLastIds[0] == 0) {
          NavInitWindow(pIVar28,false);
        }
        if ((pIVar28->DC).NavLayerActiveMask == 2) {
          pIVar34->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar14) && (pIVar22 = pIVar34->NavWindow, pIVar28 = pIVar22, pIVar22 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar28, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar28 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar22) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar22;
        pIVar22 = pIVar34->NavWindow;
      }
      pIVar34->NavDisableHighlight = false;
      pIVar34->NavDisableMouseHover = true;
      IVar31 = ImGuiNavLayer_Main;
      if (((pIVar22->DC).NavLayerActiveMask & 2) != 0) {
        IVar31 = pIVar34->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar31);
    }
  }
  else {
    pIVar34->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar16 & 1) == 0 & (bVar33 ^ 1))) || (pIVar12->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar12->IO).NavActive = false;
LAB_001cb8e9:
    bVar14 = pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar14 = (pIVar12->NavWindow->Flags & 0x40000U) == 0;
    (pIVar12->IO).NavActive = bVar14;
    if (((!bVar14) || (pIVar12->NavId == 0)) ||
       (bVar14 = true, pIVar12->NavDisableHighlight != false)) goto LAB_001cb8e9;
  }
  (pIVar12->IO).NavVisible = bVar14;
  bVar14 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar14) {
    if (pIVar12->ActiveId == 0) {
      pIVar22 = pIVar12->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        if ((pIVar12->OpenPopupStack).Size < 1) {
          if (pIVar12->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar12->NavId = 0;
            pIVar12->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar23 = ImVector<ImGuiPopupData>::back(&pIVar12->OpenPopupStack);
          if ((pIVar23->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar12->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar22->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                        ,0x20c9,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar22->ParentWindow);
        SetNavID(pIVar22->ChildId,0,0);
        pIVar12->NavIdIsAlive = false;
        if (pIVar12->NavDisableMouseHover == true) {
          pIVar12->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar12->NavActivateId = 0;
  pIVar12->NavActivateDownId = 0;
  pIVar12->NavActivatePressedId = 0;
  pIVar12->NavInputId = 0;
  if (((pIVar12->NavId == 0) || (pIVar12->NavDisableHighlight != false)) ||
     (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001cba72:
    pIVar22 = pIVar12->NavWindow;
    if (pIVar22 == (ImGuiWindow *)0x0) goto LAB_001cbadb;
    if ((pIVar22->Flags & 0x40000) != 0) {
      pIVar12->NavDisableHighlight = true;
    }
    bVar14 = false;
  }
  else {
    if (pIVar12->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          bVar14 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
          IVar26 = pIVar12->ActiveId;
          IVar17 = pIVar12->NavId;
          if (IVar26 == 0 && bVar14) {
            pIVar12->NavActivateId = IVar17;
            pIVar12->NavActivateDownId = IVar17;
LAB_001cbe89:
            pIVar12->NavActivatePressedId = IVar17;
          }
          else if (IVar26 == 0) {
            pIVar12->NavActivateDownId = IVar17;
            if (bVar14) goto LAB_001cbe89;
          }
          else {
            bVar36 = IVar26 == IVar17;
            if (!bVar36) goto LAB_001cba72;
            pIVar12->NavActivateDownId = IVar26;
            IVar17 = IVar26;
            if (bVar14 && bVar36) goto LAB_001cbe89;
          }
LAB_001cbe91:
          bVar14 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
          if (bVar14) {
            pIVar12->NavInputId = pIVar12->NavId;
          }
        }
        else if (pIVar12->ActiveId == pIVar12->NavId || pIVar12->ActiveId == 0) goto LAB_001cbe91;
      }
      goto LAB_001cba72;
    }
LAB_001cbadb:
    bVar14 = true;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  IVar26 = pIVar12->NavActivateId;
  if ((IVar26 != 0) && (pIVar12->NavActivateDownId != IVar26)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x20f7,"void ImGui::NavUpdate()");
  }
  pIVar12->NavMoveRequest = false;
  IVar26 = pIVar12->NavNextActivateId;
  if (IVar26 != 0) {
    pIVar12->NavActivateId = IVar26;
    pIVar12->NavActivateDownId = IVar26;
    pIVar12->NavActivatePressedId = IVar26;
    pIVar12->NavInputId = IVar26;
  }
  pIVar12->NavNextActivateId = 0;
  if (pIVar12->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar12->NavMoveDir = -1;
    pIVar12->NavMoveRequestFlags = 0;
    if (((!bVar14) && (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar14 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar12->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar14 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar12->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar14 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar12->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar14 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar14 ||
          (bVar14 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar14)))) {
        pIVar12->NavMoveDir = 3;
      }
    }
    pIVar12->NavMoveClipDir = pIVar12->NavMoveDir;
  }
  else {
    if ((pIVar12->NavMoveDir == -1) || (pIVar12->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2112,"void ImGui::NavUpdate()");
    }
    if (pIVar12->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x2113,"void ImGui::NavUpdate()");
    }
    pIVar12->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar34 = GImGui;
  fVar55 = 0.0;
  if ((((((uVar16 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar22 = GImGui->NavWindow, pIVar22 != (ImGuiWindow *)0x0)) &&
      (((pIVar22->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar14 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar37 = false;
    bVar36 = false;
    if (bVar14) {
      bVar36 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar14 = IsKeyDown((pIVar34->IO).KeyMap[6]);
    if (bVar14) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar14 = IsKeyPressed((pIVar34->IO).KeyMap[7],true);
    if (bVar14) {
      bVar14 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar14 = false;
    }
    bVar15 = IsKeyPressed((pIVar34->IO).KeyMap[8],true);
    if (bVar15) {
      bVar15 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar15 = false;
    }
    fVar55 = 0.0;
    if ((bVar36 != bVar37) || (bVar14 != bVar15)) {
      if (((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) {
        bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[5],true);
        if (bVar36) {
          fVar55 = (pIVar22->Scroll).y - ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y);
LAB_001ccf06:
          (pIVar22->ScrollTarget).y = fVar55;
        }
        else {
          bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[6],true);
          if (bVar36) {
            fVar55 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) + (pIVar22->Scroll).y
            ;
            goto LAB_001ccf06;
          }
          if (bVar14 == false) {
            if (bVar15 == false) goto LAB_001ccf0f;
            fVar55 = (pIVar22->ScrollMax).y;
            goto LAB_001ccf06;
          }
          (pIVar22->ScrollTarget).y = 0.0;
        }
        (pIVar22->ScrollTargetCenterRatio).y = 0.0;
LAB_001ccf0f:
        fVar55 = 0.0;
      }
      else {
        IVar31 = pIVar34->NavLayer;
        fVar55 = (pIVar22->InnerRect).Max.y;
        fVar49 = (pIVar22->InnerRect).Min.y;
        fVar50 = ImGuiWindow::CalcFontSize(pIVar22);
        fVar55 = (pIVar22->NavRectRel[IVar31].Max.y - pIVar22->NavRectRel[IVar31].Min.y) +
                 ((fVar55 - fVar49) - fVar50);
        fVar55 = (float)(~-(uint)(fVar55 <= 0.0) & (uint)fVar55);
        bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[5],true);
        if (bVar36) {
          fVar55 = -fVar55;
          pIVar34->NavMoveDir = 3;
          pIVar34->NavMoveClipDir = 2;
          pIVar34->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar36 = IsKeyPressed((pIVar34->IO).KeyMap[6],true);
          if (!bVar36) {
            pIVar25 = pIVar22->NavRectRel + IVar31;
            if (bVar14 == false) {
              fVar55 = 0.0;
              if (bVar15 != false) {
                fVar49 = ((pIVar22->ScrollMax).y + (pIVar22->SizeFull).y) - (pIVar22->Scroll).y;
                pIVar22->NavRectRel[IVar31].Max.y = fVar49;
                pIVar22->NavRectRel[IVar31].Min.y = fVar49;
                fVar49 = (pIVar25->Min).x;
                pIVar6 = &pIVar22->NavRectRel[IVar31].Max;
                if (pIVar6->x <= fVar49 && fVar49 != pIVar6->x) {
                  pIVar22->NavRectRel[IVar31].Max.x = 0.0;
                  (pIVar25->Min).x = 0.0;
                }
                pIVar34->NavMoveDir = 2;
                pIVar34->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001cbca8;
            }
            fVar55 = -(pIVar22->Scroll).y;
            pIVar22->NavRectRel[IVar31].Max.y = fVar55;
            pIVar22->NavRectRel[IVar31].Min.y = fVar55;
            fVar55 = (pIVar25->Min).x;
            pIVar6 = &pIVar22->NavRectRel[IVar31].Max;
            if (pIVar6->x <= fVar55 && fVar55 != pIVar6->x) {
              pIVar22->NavRectRel[IVar31].Max.x = 0.0;
              (pIVar25->Min).x = 0.0;
            }
            pIVar34->NavMoveDir = 3;
            pIVar34->NavMoveRequestFlags = 0x50;
            goto LAB_001ccf0f;
          }
          pIVar34->NavMoveDir = 2;
          pIVar34->NavMoveClipDir = 3;
          pIVar34->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001cbca8:
  if (pIVar12->NavMoveDir == -1) {
    if ((pIVar12->NavMoveRequest & 1U) != 0) goto LAB_001cbcd7;
  }
  else {
    pIVar12->NavMoveRequest = true;
    pIVar12->NavMoveDirLast = pIVar12->NavMoveDir;
LAB_001cbcd7:
    if (pIVar12->NavId == 0) {
      pIVar12->NavInitRequest = true;
      pIVar12->NavInitRequestFromMove = true;
      pIVar12->NavInitResultId = 0;
      pIVar12->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar22 = pIVar12->NavWindow;
  if (((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar49 = ImGuiWindow::CalcFontSize(pIVar22);
    fVar49 = (float)(int)(fVar49 * 100.0 * (pIVar12->IO).DeltaTime + 0.5);
    if ((((pIVar22->DC).NavLayerActiveMask == 0) && ((pIVar22->DC).NavHasScroll == true)) &&
       (pIVar12->NavMoveRequest == true)) {
      uVar16 = pIVar12->NavMoveDir;
      if (uVar16 < 2) {
        lVar21 = 0x6c;
        lVar27 = 100;
        uVar39 = 0;
        lStack_70 = 0x54;
      }
      else {
        if ((uVar16 & 0xfffffffe) != 2) goto LAB_001cbf1f;
        uVar39 = 2;
        lVar21 = 0x70;
        lVar27 = 0x68;
        lStack_70 = 0x58;
      }
      *(float *)((long)&pIVar22->Name + lVar27) =
           (float)(int)(*(float *)(&DAT_00297fd8 + (ulong)(uVar16 == uVar39) * 4) * fVar49 +
                       *(float *)((long)&pIVar22->Name + lStack_70));
      *(undefined4 *)((long)&pIVar22->Name + lVar21) = 0;
    }
LAB_001cbf1f:
    IVar41 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar50 = IVar41.x;
    fVar40 = IVar41.y;
    if (((fVar50 != 0.0) || (NAN(fVar50))) && (pIVar22->ScrollbarX == true)) {
      (pIVar22->ScrollTarget).x = (float)(int)(fVar50 * fVar49 + (pIVar22->Scroll).x);
      (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
    if ((fVar40 != 0.0) || (NAN(fVar40))) {
      (pIVar22->ScrollTarget).y = (float)(int)(fVar40 * fVar49 + (pIVar22->Scroll).y);
      (pIVar22->ScrollTargetCenterRatio).y = 0.0;
      pIVar12->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar12->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultLocal).ID = 0;
  (pIVar12->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar12->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar12->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar12->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar12->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar12->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar12->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar12->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar12->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar12->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar12->NavMoveResultOther).ID = 0;
  (pIVar12->NavMoveResultOther).FocusScopeId = 0;
  (pIVar12->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar12->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar12->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar12->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar12->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar12->NavMoveRequest == true) && (pIVar12->NavMoveFromClampedRefRect == true)) &&
     (pIVar12->NavLayer == ImGuiNavLayer_Main)) {
    pIVar22 = pIVar12->NavWindow;
    IVar41 = (pIVar22->InnerRect).Min;
    fVar49 = (pIVar22->Pos).x;
    fVar50 = (pIVar22->Pos).y;
    IVar43 = (pIVar22->InnerRect).Max;
    local_48.Max.x = (IVar43.x - fVar49) + 1.0;
    local_48.Max.y = (IVar43.y - fVar50) + 1.0;
    local_48.Min.y = (IVar41.y - fVar50) + -1.0;
    local_48.Min.x = (IVar41.x - fVar49) + -1.0;
    bVar14 = ImRect::Contains(&local_48,pIVar22->NavRectRel);
    if (!bVar14) {
      fVar49 = ImGuiWindow::CalcFontSize(pIVar22);
      auVar52._0_4_ = fVar49 * 0.5;
      auVar51._0_4_ = local_48.Max.x - local_48.Min.x;
      auVar51._4_4_ = local_48.Max.y - local_48.Min.y;
      auVar51._8_4_ = local_48.Max.x - local_48.Max.x;
      auVar51._12_4_ = local_48.Max.y - local_48.Max.y;
      auVar52._4_4_ = auVar52._0_4_;
      auVar52._8_4_ = auVar52._0_4_;
      auVar52._12_4_ = auVar52._0_4_;
      auVar52 = minps(auVar51,auVar52);
      local_48.Max.x = local_48.Max.x - auVar52._0_4_;
      local_48.Max.y = local_48.Max.y - auVar52._4_4_;
      local_48.Min.y = auVar52._4_4_ + local_48.Min.y;
      local_48.Min.x = auVar52._0_4_ + local_48.Min.x;
      ImRect::ClipWith(pIVar22->NavRectRel + pIVar12->NavLayer,&local_48);
      pIVar12->NavId = 0;
      pIVar12->NavFocusScopeId = 0;
    }
    pIVar12->NavMoveFromClampedRefRect = false;
  }
  pIVar22 = pIVar12->NavWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    IVar43 = (GImGui->IO).DisplaySize;
    fVar49 = 0.0;
    fVar50 = 0.0;
  }
  else {
    IVar41 = pIVar22->NavRectRel[pIVar12->NavLayer].Min;
    IVar43 = pIVar22->NavRectRel[pIVar12->NavLayer].Max;
    fVar40 = IVar41.x;
    fVar56 = IVar41.y;
    IVar42.x = 0.0;
    IVar42.y = 0.0;
    fVar49 = 0.0;
    fVar50 = 0.0;
    if (fVar56 <= IVar43.y && fVar40 <= IVar43.x) {
      fVar49 = fVar40;
      fVar50 = fVar56;
      IVar42 = IVar43;
    }
    fVar40 = (pIVar22->Pos).x;
    fVar49 = fVar49 + fVar40;
    fVar56 = (pIVar22->Pos).y;
    fVar50 = fVar50 + fVar56;
    IVar43.x = IVar42.x + fVar40;
    IVar43.y = IVar42.y + fVar56;
  }
  (pIVar12->NavScoringRectScreen).Min.y = fVar50 + fVar55;
  fVar56 = IVar43.y + fVar55;
  (pIVar12->NavScoringRectScreen).Max.y = fVar56;
  fVar40 = fVar49 + 1.0;
  if (IVar43.x <= fVar49 + 1.0) {
    fVar40 = IVar43.x;
  }
  (pIVar12->NavScoringRectScreen).Min.x = fVar40;
  (pIVar12->NavScoringRectScreen).Max.x = fVar40;
  if (fVar56 < fVar50 + fVar55) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x2164,"void ImGui::NavUpdate()");
  }
  pIVar12->NavScoringCount = 0;
  pIVar34 = GImGui;
  pIVar6 = &(GImGui->IO).MousePos;
  bVar14 = IsMousePosValid(pIVar6);
  if (bVar14) {
    IVar41 = (pIVar34->IO).MousePos;
    IVar44.x = (float)(int)IVar41.x;
    IVar44.y = (float)(int)IVar41.y;
    pIVar34->LastValidMousePos = IVar44;
    (pIVar34->IO).MousePos = IVar44;
  }
  bVar14 = IsMousePosValid(pIVar6);
  if ((bVar14) && (bVar14 = IsMousePosValid(&(pIVar34->IO).MousePosPrev), bVar14)) {
    IVar41 = (pIVar34->IO).MousePos;
    IVar43 = (pIVar34->IO).MousePosPrev;
    IVar45.x = IVar41.x - IVar43.x;
    IVar45.y = IVar41.y - IVar43.y;
    (pIVar34->IO).MouseDelta = IVar45;
    if (((IVar45.x != 0.0) || (NAN(IVar45.x))) || ((IVar45.y != 0.0 || (NAN(IVar45.y))))) {
      pIVar34->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar34->IO).MouseDelta.x = 0.0;
    (pIVar34->IO).MouseDelta.y = 0.0;
  }
  (pIVar34->IO).MousePosPrev = (pIVar34->IO).MousePos;
  for (lVar21 = 0; pIVar12 = local_38, lVar21 != 5; lVar21 = lVar21 + 1) {
    if ((pIVar34->IO).MouseDown[lVar21] == true) {
      fVar55 = (pIVar34->IO).MouseDownDuration[lVar21];
      pbVar35 = (pIVar34->IO).MouseClicked + lVar21;
      *pbVar35 = fVar55 < 0.0;
      pbVar35[10] = false;
      (pIVar34->IO).MouseDownDurationPrev[lVar21] = fVar55;
      if (0.0 <= fVar55) {
        (pIVar34->IO).MouseDownDuration[lVar21] = fVar55 + (pIVar34->IO).DeltaTime;
        (pIVar34->IO).MouseDoubleClicked[lVar21] = false;
        bVar14 = IsMousePosValid(pIVar6);
        auVar48 = ZEXT816(0);
        if (bVar14) {
          IVar41 = (pIVar34->IO).MousePos;
          IVar43 = (pIVar34->IO).MouseClickedPos[lVar21];
          auVar48._0_4_ = IVar41.x - IVar43.x;
          auVar48._4_4_ = IVar41.y - IVar43.y;
          auVar48._8_8_ = 0;
        }
        fVar55 = (pIVar34->IO).MouseDragMaxDistanceSqr[lVar21];
        fVar49 = auVar48._0_4_ * auVar48._0_4_ + auVar48._4_4_ * auVar48._4_4_;
        uVar16 = -(uint)(fVar49 <= fVar55);
        (pIVar34->IO).MouseDragMaxDistanceSqr[lVar21] =
             (float)(~uVar16 & (uint)fVar49 | (uint)fVar55 & uVar16);
        IVar41 = (pIVar34->IO).MouseDragMaxDistanceAbs[lVar21];
        fVar55 = IVar41.x;
        fVar49 = IVar41.y;
        auVar53._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar53._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar53._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar52 = maxps(auVar53,auVar48);
        uVar16 = -(uint)(auVar52._0_4_ <= fVar55);
        uVar39 = -(uint)(auVar52._4_4_ <= fVar49);
        (pIVar34->IO).MouseDragMaxDistanceAbs[lVar21] =
             (ImVec2)(CONCAT44(~uVar39 & (uint)auVar52._4_4_,~uVar16 & (uint)auVar52._0_4_) |
                     CONCAT44((uint)fVar49 & uVar39,(uint)fVar55 & uVar16));
      }
      else {
        (pIVar34->IO).MouseDownDuration[lVar21] = 0.0;
        (pIVar34->IO).MouseDoubleClicked[lVar21] = false;
        dVar46 = pIVar34->Time;
        if ((float)(dVar46 - (pIVar34->IO).MouseClickedTime[lVar21]) <
            (pIVar34->IO).MouseDoubleClickTime) {
          bVar14 = IsMousePosValid(pIVar6);
          fVar55 = 0.0;
          fVar49 = 0.0;
          if (bVar14) {
            IVar41 = (pIVar34->IO).MousePos;
            IVar43 = (pIVar34->IO).MouseClickedPos[lVar21];
            fVar55 = IVar41.x - IVar43.x;
            fVar49 = IVar41.y - IVar43.y;
          }
          fVar50 = (pIVar34->IO).MouseDoubleClickMaxDist;
          dVar46 = -3.4028234663852886e+38;
          if (fVar55 * fVar55 + fVar49 * fVar49 < fVar50 * fVar50) {
            (pIVar34->IO).MouseDoubleClicked[lVar21] = true;
            dVar46 = -3.4028234663852886e+38;
          }
        }
        (pIVar34->IO).MouseClickedTime[lVar21] = dVar46;
        (pIVar34->IO).MouseClickedPos[lVar21] = (pIVar34->IO).MousePos;
        (pIVar34->IO).MouseDownWasDoubleClick[lVar21] = (pIVar34->IO).MouseDoubleClicked[lVar21];
        pIVar7 = (pIVar34->IO).MouseDragMaxDistanceAbs + lVar21;
        pIVar7->x = 0.0;
        pIVar7->y = 0.0;
        (pIVar34->IO).MouseDragMaxDistanceSqr[lVar21] = 0.0;
      }
    }
    else {
      (pIVar34->IO).MouseClicked[lVar21] = false;
      fVar55 = (pIVar34->IO).MouseDownDuration[lVar21];
      (pIVar34->IO).MouseReleased[lVar21] = 0.0 <= fVar55;
      pbVar35 = (pIVar34->IO).MouseClicked + lVar21;
      (pIVar34->IO).MouseDownDurationPrev[lVar21] = fVar55;
      (pIVar34->IO).MouseDownDuration[lVar21] = -1.0;
      (pIVar34->IO).MouseDoubleClicked[lVar21] = false;
    }
    if (((pIVar34->IO).MouseDown[lVar21] == false) && ((pIVar34->IO).MouseReleased[lVar21] == false)
       ) {
      (pIVar34->IO).MouseDownWasDoubleClick[lVar21] = false;
    }
    if (*pbVar35 == true) {
      pIVar34->NavDisableMouseHover = false;
    }
  }
  fVar55 = (local_38->IO).DeltaTime;
  iVar19 = local_38->FramerateSecPerFrameIdx;
  local_38->FramerateSecPerFrameAccum =
       (fVar55 - local_38->FramerateSecPerFrame[iVar19]) + local_38->FramerateSecPerFrameAccum;
  local_38->FramerateSecPerFrame[iVar19] = fVar55;
  local_38->FramerateSecPerFrameIdx = (iVar19 + 1) % 0x78;
  uVar16 = -(uint)(0.0 < local_38->FramerateSecPerFrameAccum);
  (local_38->IO).Framerate =
       (float)(~uVar16 & 0x7f7fffff |
              (uint)(1.0 / (local_38->FramerateSecPerFrameAccum / 120.0)) & uVar16);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar22 = GetTopMostPopupModal();
  if ((pIVar22 != (ImGuiWindow *)0x0) ||
     ((pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar12->NavWindowingHighlightAlpha)))) {
    fVar55 = (pIVar12->IO).DeltaTime * 6.0 + pIVar12->DimBgRatio;
    if (1.0 <= fVar55) {
      fVar55 = 1.0;
    }
    pIVar12->DimBgRatio = fVar55;
  }
  else {
    fVar55 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->DimBgRatio;
    pIVar12->DimBgRatio = (float)(-(uint)(0.0 <= fVar55) & (uint)fVar55);
  }
  pIVar12->MouseCursor = 0;
  pIVar12->WantTextInputNextFrame = -1;
  pIVar12->WantCaptureMouseNextFrame = -1;
  pIVar12->WantCaptureKeyboardNextFrame = -1;
  (pIVar12->PlatformImePos).x = 1.0;
  pIVar34 = GImGui;
  (pIVar12->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar14 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar14) &&
        (fVar55 = (pIVar34->IO).MouseDragThreshold,
        fVar49 = (pIVar34->IO).MousePos.x - (pIVar34->WheelingWindowRefMousePos).x,
        fVar50 = (pIVar34->IO).MousePos.y - (pIVar34->WheelingWindowRefMousePos).y,
        fVar55 * fVar55 < fVar49 * fVar49 + fVar50 * fVar50)) ||
       (pIVar34->WheelingWindowTimer <= 0.0)) {
      pIVar34->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar34->WheelingWindowTimer = 0.0;
    }
  }
  fVar55 = (pIVar34->IO).MouseWheel;
  if (((((fVar55 != 0.0) || (fVar49 = (pIVar34->IO).MouseWheelH, fVar49 != 0.0)) || (NAN(fVar49)))
      && ((pIVar22 = pIVar34->WheelingWindow, pIVar22 != (ImGuiWindow *)0x0 ||
          (pIVar22 = pIVar34->HoveredWindow, pIVar22 != (ImGuiWindow *)0x0)))) &&
     (pIVar22->Collapsed == false)) {
    if ((fVar55 != 0.0) || (NAN(fVar55))) {
      if ((pIVar34->IO).KeyCtrl == true) {
        if ((pIVar34->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar22);
          fVar55 = pIVar22->FontWindowScale;
          fVar50 = (pIVar34->IO).MouseWheel * 0.1 + fVar55;
          fVar49 = 2.5;
          if (fVar50 <= 2.5) {
            fVar49 = fVar50;
          }
          fVar49 = (float)(-(uint)(fVar50 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar50 < 0.5) & (uint)fVar49);
          pIVar22->FontWindowScale = fVar49;
          if ((pIVar22->Flags & 0x1000000) == 0) {
            fVar49 = fVar49 / fVar55;
            IVar41 = pIVar22->Size;
            IVar43 = (pIVar34->IO).MousePos;
            fVar55 = (pIVar22->Pos).x;
            fVar50 = (pIVar22->Pos).y;
            auVar54._0_4_ = (IVar43.x - fVar55) * (1.0 - fVar49) * IVar41.x;
            auVar54._4_4_ = (IVar43.y - fVar50) * (1.0 - fVar49) * IVar41.y;
            auVar54._8_8_ = 0;
            auVar11._8_8_ = 0;
            auVar11._0_4_ = IVar41.x;
            auVar11._4_4_ = IVar41.y;
            auVar52 = divps(auVar54,auVar11);
            local_48.Min.x = auVar52._0_4_ + fVar55;
            local_48.Min.y = auVar52._4_4_ + fVar50;
            SetWindowPos(pIVar22,&local_48.Min,0);
            IVar47.x = (float)(int)((pIVar22->Size).x * fVar49);
            IVar47.y = (float)(int)((pIVar22->Size).y * fVar49);
            IVar10.y = (float)(int)((pIVar22->SizeFull).y * fVar49);
            IVar10.x = (float)(int)((pIVar22->SizeFull).x * fVar49);
            pIVar22->Size = IVar47;
            pIVar22->SizeFull = IVar10;
          }
          goto LAB_001cc6d8;
        }
      }
      else if ((pIVar34->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar22);
        while ((uVar16 = pIVar22->Flags, (uVar16 >> 0x18 & 1) != 0 &&
               (((uVar16 & 0x210) == 0x10 ||
                ((fVar49 = (pIVar22->ScrollMax).y, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
          pIVar22 = pIVar22->ParentWindow;
        }
        if ((uVar16 & 0x210) == 0) {
          fVar50 = ((pIVar22->InnerRect).Max.y - (pIVar22->InnerRect).Min.y) * 0.67;
          fVar40 = ImGuiWindow::CalcFontSize(pIVar22);
          fVar49 = fVar40 * 5.0;
          if (fVar50 <= fVar40 * 5.0) {
            fVar49 = fVar50;
          }
          (pIVar22->ScrollTarget).y = (pIVar22->Scroll).y - fVar55 * (float)(int)fVar49;
          (pIVar22->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar55 = (pIVar34->IO).MouseWheelH;
    if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar34->IO).KeyShift == true)) {
      fVar55 = (pIVar34->IO).MouseWheel;
      if (((fVar55 == 0.0) && (!NAN(fVar55))) || ((pIVar34->IO).KeyShift != true))
      goto LAB_001cc6d8;
    }
    if ((pIVar34->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar22);
      while ((uVar16 = pIVar22->Flags, (uVar16 >> 0x18 & 1) != 0 &&
             (((uVar16 & 0x210) == 0x10 ||
              ((fVar49 = (pIVar22->ScrollMax).x, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
        pIVar22 = pIVar22->ParentWindow;
      }
      if ((uVar16 & 0x210) == 0) {
        fVar50 = ((pIVar22->InnerRect).Max.x - (pIVar22->InnerRect).Min.x) * 0.67;
        fVar40 = ImGuiWindow::CalcFontSize(pIVar22);
        fVar49 = fVar40 + fVar40;
        if (fVar50 <= fVar40 + fVar40) {
          fVar49 = fVar50;
        }
        (pIVar22->ScrollTarget).x = (pIVar22->Scroll).x - fVar55 * (float)(int)fVar49;
        (pIVar22->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_001cc6d8:
  pIVar22 = pIVar12->NavWindow;
  if ((((pIVar22 == (ImGuiWindow *)0x0) || (pIVar22->Active != true)) ||
      ((pIVar22->Flags & 0x40000) != 0)) || ((pIVar12->IO).KeyCtrl != false)) {
    bVar14 = false;
  }
  else {
    bVar14 = IsKeyPressedMap(0,true);
  }
  pIVar12->FocusTabPressed = bVar14;
  if ((bVar14 == false) || (pIVar12->ActiveId != 0)) {
    pIVar22 = pIVar12->FocusRequestNextWindow;
  }
  else {
    pIVar22 = pIVar12->NavWindow;
    pIVar12->FocusRequestNextWindow = pIVar22;
    pIVar12->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar12->NavId == 0) || (pIVar12->NavIdTabCounter == 0x7fffffff)) {
      iVar19 = -(uint)(pIVar12->IO).KeyShift;
    }
    else {
      iVar19 = pIVar12->NavIdTabCounter + (-(uint)(pIVar12->IO).KeyShift | 1) + 1;
    }
    pIVar12->FocusRequestNextCounterTabStop = iVar19;
  }
  pIVar12->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar12->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar12->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    pIVar12->FocusRequestCurrWindow = pIVar22;
    if ((pIVar12->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterRegular, iVar19 != -1)) {
      pIVar12->FocusRequestCurrCounterRegular =
           (pIVar12->FocusRequestNextCounterRegular + iVar19 + 1) % (iVar19 + 1);
    }
    if ((pIVar12->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar19 = (pIVar22->DC).FocusCounterTabStop, iVar19 != -1)) {
      pIVar12->FocusRequestCurrCounterTabStop =
           (pIVar12->FocusRequestNextCounterTabStop + iVar19 + 1) % (iVar19 + 1);
    }
    pIVar12->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar12->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar12->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar12->NavIdTabCounter = 0x7fffffff;
  iVar19 = (pIVar12->WindowsFocusOrder).Size;
  if (iVar19 == (pIVar12->Windows).Size) {
    fVar55 = (pIVar12->IO).ConfigWindowsMemoryCompactTimer;
    if (0.0 <= fVar55) {
      fVar55 = (float)pIVar12->Time - fVar55;
    }
    else {
      fVar55 = 3.4028235e+38;
    }
    for (i = 0; i != iVar19; i = i + 1) {
      ppIVar24 = ImVector<ImGuiWindow_*>::operator[](&pIVar12->Windows,i);
      pIVar22 = *ppIVar24;
      bVar14 = pIVar22->Active;
      pIVar22->WasActive = bVar14;
      pIVar22->BeginCount = 0;
      pIVar22->Active = false;
      pIVar22->WriteAccessed = false;
      if (((bVar14 == false) && (pIVar22->MemoryCompacted == false)) &&
         (pIVar22->LastTimeActive <= fVar55 && fVar55 != pIVar22->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar22);
      }
      iVar19 = (pIVar12->Windows).Size;
    }
    if ((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (pIVar12->NavWindow->WasActive == false)) {
      FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
    }
    ImVector<ImGuiWindow_*>::resize(&pIVar12->CurrentWindowStack,0);
    ImVector<ImGuiPopupData>::resize(&pIVar12->BeginPopupStack,0);
    ClosePopupsOverWindow(pIVar12->NavWindow,false);
    pIVar34 = GImGui;
    GImGui->DebugItemPickerBreakId = 0;
    if (pIVar34->DebugItemPickerActive == true) {
      uVar16 = pIVar34->HoveredIdPreviousFrame;
      pIVar34->MouseCursor = 7;
      bVar14 = IsKeyPressedMap(0xe,true);
      if (bVar14) {
        pIVar34->DebugItemPickerActive = false;
      }
      pIVar13 = GImGui;
      fVar55 = (GImGui->IO).MouseDownDuration[0];
      if ((fVar55 != 0.0) || (NAN(fVar55))) {
        uVar39 = (uint)(uVar16 == 0);
      }
      else if (uVar16 == 0) {
        uVar39 = 1;
      }
      else {
        pIVar34->DebugItemPickerBreakId = uVar16;
        pIVar34->DebugItemPickerActive = false;
        uVar39 = 0;
      }
      pIVar4 = &pIVar13->NextWindowData;
      *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
      (pIVar13->NextWindowData).BgAlphaVal = 0.6;
      BeginTooltip();
      Text("HoveredId: 0x%08X",(ulong)uVar16);
      Text("Press ESC to abort picking.");
      TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar39 << 4)),
                  "Click to break in debugger!");
      EndTooltip();
      pIVar34 = GImGui;
    }
    *(byte *)&(pIVar34->NextWindowData).Flags = (byte)(pIVar34->NextWindowData).Flags | 2;
    (pIVar34->NextWindowData).SizeVal.x = 400.0;
    (pIVar34->NextWindowData).SizeVal.y = 400.0;
    (pIVar34->NextWindowData).SizeCond = 4;
    Begin("Debug##Default",(bool *)0x0,0);
    pIVar12->WithinFrameScopeWithImplicitWindow = true;
    return;
  }
  __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0xeab,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterRegular = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTabStop = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTabStop = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterRegular = g.FocusRequestCurrCounterTabStop = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterRegular != INT_MAX && window->DC.FocusCounterRegular != -1)
            g.FocusRequestCurrCounterRegular = ImModPositive(g.FocusRequestNextCounterRegular, window->DC.FocusCounterRegular + 1);
        if (g.FocusRequestNextCounterTabStop != INT_MAX && window->DC.FocusCounterTabStop != -1)
            g.FocusRequestCurrCounterTabStop = ImModPositive(g.FocusRequestNextCounterTabStop, window->DC.FocusCounterTabStop + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterRegular = g.FocusRequestNextCounterTabStop = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.WithinFrameScopeWithImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}